

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpath.c
# Opt level: O1

void xmlXPathLastFunction(xmlXPathParserContextPtr ctxt,int nargs)

{
  xmlXPathObjectPtr value;
  int iVar1;
  
  if (ctxt == (xmlXPathParserContextPtr)0x0) {
    return;
  }
  if (nargs == 0) {
    if (ctxt->valueNr < 0) {
      iVar1 = 0x17;
    }
    else {
      iVar1 = ctxt->context->contextSize;
      if (-1 < iVar1) {
        value = xmlXPathCacheNewFloat(ctxt,(double)iVar1);
        xmlXPathValuePush(ctxt,value);
        return;
      }
      iVar1 = 0xd;
    }
  }
  else {
    iVar1 = 0xc;
  }
  xmlXPathErr(ctxt,iVar1);
  return;
}

Assistant:

void
xmlXPathLastFunction(xmlXPathParserContextPtr ctxt, int nargs) {
    CHECK_ARITY(0);
    if (ctxt->context->contextSize >= 0) {
	xmlXPathValuePush(ctxt,
	    xmlXPathCacheNewFloat(ctxt, (double) ctxt->context->contextSize));
    } else {
	XP_ERROR(XPATH_INVALID_CTXT_SIZE);
    }
}